

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlCtxtDumpDtdNode(xmlDebugCtxtPtr ctxt,xmlDtdPtr dtd)

{
  xmlCtxtDumpSpaces(ctxt);
  if (dtd->type == XML_DTD_NODE) {
    if (ctxt->check == 0) {
      if (dtd->name == (xmlChar *)0x0) {
        fwrite("DTD",3,1,(FILE *)ctxt->output);
      }
      else {
        fprintf((FILE *)ctxt->output,"DTD(%s)");
      }
      if (dtd->ExternalID != (xmlChar *)0x0) {
        fprintf((FILE *)ctxt->output,", PUBLIC %s");
      }
      if (dtd->SystemID != (xmlChar *)0x0) {
        fprintf((FILE *)ctxt->output,", SYSTEM %s");
      }
      fputc(10,(FILE *)ctxt->output);
    }
    xmlCtxtGenericNodeCheck(ctxt,(xmlNodePtr)dtd);
    return;
  }
  xmlDebugErr(ctxt,0x139e,"Node is not a DTD");
  return;
}

Assistant:

static void
xmlCtxtDumpDtdNode(xmlDebugCtxtPtr ctxt, xmlDtdPtr dtd)
{
    xmlCtxtDumpSpaces(ctxt);

    if (dtd == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "DTD node is NULL\n");
        return;
    }

    if (dtd->type != XML_DTD_NODE) {
	xmlDebugErr(ctxt, XML_CHECK_NOT_DTD,
	            "Node is not a DTD");
        return;
    }
    if (!ctxt->check) {
        if (dtd->name != NULL)
            fprintf(ctxt->output, "DTD(%s)", (char *) dtd->name);
        else
            fprintf(ctxt->output, "DTD");
        if (dtd->ExternalID != NULL)
            fprintf(ctxt->output, ", PUBLIC %s", (char *) dtd->ExternalID);
        if (dtd->SystemID != NULL)
            fprintf(ctxt->output, ", SYSTEM %s", (char *) dtd->SystemID);
        fprintf(ctxt->output, "\n");
    }
    /*
     * Do a bit of checking
     */
    xmlCtxtGenericNodeCheck(ctxt, (xmlNodePtr) dtd);
}